

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O3

int __thiscall OutputBuffer::write2fd(OutputBuffer *this,int fd)

{
  Chunk *pCVar1;
  ssize_t sVar2;
  int *piVar3;
  int len;
  
  pCVar1 = (this->super_BufferBase).data_buf;
  if ((pCVar1 != (Chunk *)0x0) && (pCVar1->head == 0)) {
    do {
      pCVar1 = (this->super_BufferBase).data_buf;
      sVar2 = write(fd,pCVar1->data,(long)pCVar1->length);
      len = (int)sVar2;
      if (len != -1) {
        if (len < 1) {
          return len;
        }
        Chunk::pop((this->super_BufferBase).data_buf,len);
        Chunk::adjust((this->super_BufferBase).data_buf);
        return len;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    return -(uint)(*piVar3 != 0xb);
  }
  __assert_fail("data_buf != nullptr && data_buf->head == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                ,0x87,"int OutputBuffer::write2fd(int)");
}

Assistant:

int OutputBuffer::write2fd(int fd)
{
    assert(data_buf != nullptr && data_buf->head == 0);

    int already_write = 0;

    do { 
        already_write = write(fd, data_buf->data, data_buf->length);
    } while (already_write == -1 && errno == EINTR);

    if (already_write > 0) {
        data_buf->pop(already_write);
        data_buf->adjust();
    }

    if (already_write == -1 && errno == EAGAIN) {
        already_write = 0;
    }

    return already_write;
}